

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCollisionModelBullet.cpp
# Opt level: O1

bool __thiscall
chrono::collision::ChCollisionModelBullet::AddPoint
          (ChCollisionModelBullet *this,shared_ptr<chrono::ChMaterialSurface> *material,
          double radius,ChVector<double> *pos)

{
  ChCollisionShapeBullet *this_00;
  cbtConvexInternalShape *this_01;
  float fVar1;
  shared_ptr<chrono::ChMaterialSurface> local_80;
  double local_70;
  ChMatrix33<double> local_68;
  
  local_70 = radius;
  (*(this->super_ChCollisionModel)._vptr_ChCollisionModel[0x22])();
  fVar1 = SUB84(radius,0);
  this_00 = (ChCollisionShapeBullet *)::operator_new(0x28);
  local_80.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (material->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_80.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (material->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
          _M_refcount._M_pi;
  if (local_80.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_80.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_80.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_80.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_80.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  ChCollisionShapeBullet::ChCollisionShapeBullet(this_00,POINT,&local_80);
  if (local_80.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_80.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  this_01 = (cbtConvexInternalShape *)cbtAlignedAllocInternal(0x48,0x10);
  (*(this->super_ChCollisionModel)._vptr_ChCollisionModel[0x25])(this);
  cbtConvexInternalShape::cbtConvexInternalShape(this_01);
  *(undefined8 *)&(this_01->super_cbtConvexShape).super_cbtCollisionShape.field_0x1c =
       0x3f8000003f800000;
  *(undefined4 *)&this_01->field_0x24 = 0x3f800000;
  *(undefined8 *)&this_01->field_0x28 = 0;
  (this_01->m_implicitShapeDimensions).m_floats[1] = 0.0;
  (this_01->m_implicitShapeDimensions).m_floats[2] = 0.0;
  (this_01->m_implicitShapeDimensions).m_floats[3] = 0.0;
  (this_01->m_implicitShapeDimensions).m_floats[0] = (float)((double)fVar1 + local_70);
  this_01->m_collisionMargin = (float)((double)fVar1 + local_70);
  this_01->m_padding = 0.0;
  (this_01->super_cbtConvexShape).super_cbtCollisionShape._vptr_cbtCollisionShape =
       (_func_int **)&PTR__cbtConvexShape_00b63fe8;
  (this_01->super_cbtConvexShape).super_cbtCollisionShape.m_shapeType = 0x16;
  this_00->m_bt_shape = (cbtCollisionShape *)this_01;
  (*(this->super_ChCollisionModel)._vptr_ChCollisionModel[0x2b])(this);
  (*(this_01->super_cbtConvexShape).super_cbtCollisionShape._vptr_cbtCollisionShape[0xb])(this_01);
  local_68.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] = 0.0;
  local_68.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] = 0.0;
  local_68.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] = 0.0;
  local_68.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] = 0.0;
  local_68.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] = 0.0;
  local_68.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] = 0.0;
  local_68.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] = 1.0;
  local_68.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] = 1.0;
  local_68.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] = 1.0;
  injectShape(this,pos,&local_68,this_00);
  return true;
}

Assistant:

bool ChCollisionModelBullet::AddPoint(std::shared_ptr<ChMaterialSurface> material,
                                      double radius,
                                      const ChVector<>& pos) {
    // adjust default inward 'safe' margin (always as radius)
    SetSafeMargin(radius);

    auto shape = new ChCollisionShapeBullet(ChCollisionShape::Type::POINT, material);

    shape->m_bt_shape = new cbtPointShape((cbtScalar)(radius + GetEnvelope()));
    shape->m_bt_shape->setMargin((cbtScalar)GetSuggestedFullMargin());

    injectShape(pos, ChMatrix33<>(1), shape);
    return true;
}